

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_post_demo.c
# Opt level: O0

int format_result(per_session_data__post_demo *pss)

{
  int iVar1;
  uint uVar2;
  char *str;
  char *pcVar3;
  char *pcVar4;
  uchar *str_00;
  int local_2c;
  int n;
  uchar *end;
  uchar *start;
  uchar *p;
  per_session_data__post_demo *pss_local;
  
  str = pss->result + 0x10;
  iVar1 = lws_snprintf(str,(long)pss + (0x817 - (long)str),
                       "<!DOCTYPE html><html lang=\"en\"><head><meta charset=utf-8 http-equiv=\"Content-Language\" content=\"en\"/><title>LWS Server Status</title></head><body><h1>Form results (after urldecoding)</h1><table><tr><td>Name</td><td>Length</td><td>Value</td></tr>"
                      );
  start = (uchar *)(str + iVar1);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    pcVar3 = lws_spa_get_string(pss->spa,local_2c);
    if (pcVar3 == (char *)0x0) {
      iVar1 = lws_snprintf((char *)start,(long)pss + (0x817 - (long)start),
                           "<tr><td><b>%s</b></td><td>0</td><td>NULL</td></tr>",
                           param_names[local_2c]);
    }
    else {
      pcVar3 = param_names[local_2c];
      uVar2 = lws_spa_get_length(pss->spa,local_2c);
      pcVar4 = lws_spa_get_string(pss->spa,local_2c);
      iVar1 = lws_snprintf((char *)start,(long)pss + (0x817 - (long)start),
                           "<tr><td><b>%s</b></td><td>%d</td><td>%s</td></tr>",pcVar3,(ulong)uVar2,
                           pcVar4);
    }
    start = start + iVar1;
  }
  iVar1 = lws_snprintf((char *)start,(long)pss + (0x817 - (long)start),
                       "</table><br><b>filename:</b> %s, <b>length</b> %ld",pss->filename,
                       pss->file_length);
  str_00 = start + iVar1;
  iVar1 = lws_snprintf((char *)str_00,(long)pss + (0x817 - (long)str_00),"</body></html>");
  return ((int)str_00 + iVar1) - (int)str;
}

Assistant:

static int
format_result(struct per_session_data__post_demo *pss)
{
	unsigned char *p, *start, *end;
	int n;

	p = (unsigned char *)pss->result + LWS_PRE;
	start = p;
	end = p + sizeof(pss->result) - LWS_PRE - 1;

	p += lws_snprintf((char *)p, end -p,
			"<!DOCTYPE html><html lang=\"en\"><head>"
			"<meta charset=utf-8 http-equiv=\"Content-Language\" "
			"content=\"en\"/>"
	  "<title>LWS Server Status</title>"
	  "</head><body><h1>Form results (after urldecoding)</h1>"
	  "<table><tr><td>Name</td><td>Length</td><td>Value</td></tr>");

	for (n = 0; n < (int)LWS_ARRAY_SIZE(param_names); n++) {
		if (!lws_spa_get_string(pss->spa, n))
			p += lws_snprintf((char *)p, end - p,
			    "<tr><td><b>%s</b></td><td>0"
			    "</td><td>NULL</td></tr>",
			    param_names[n]);
		else
			p += lws_snprintf((char *)p, end - p,
			    "<tr><td><b>%s</b></td><td>%d"
			    "</td><td>%s</td></tr>",
			    param_names[n],
			    lws_spa_get_length(pss->spa, n),
			    lws_spa_get_string(pss->spa, n));
	}

	p += lws_snprintf((char *)p, end - p,
			"</table><br><b>filename:</b> %s, "
			"<b>length</b> %ld",
			pss->filename, pss->file_length);

	p += lws_snprintf((char *)p, end - p, "</body></html>");

	return (int)lws_ptr_diff(p, start);
}